

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType1.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::GridDataType1::AddValue(GridDataType1 *this,KUINT16 V)

{
  KUINT16 local_12;
  GridDataType1 *pGStack_10;
  KUINT16 V_local;
  GridDataType1 *this_local;
  
  this->m_ui16NumValues = this->m_ui16NumValues + 1;
  local_12 = V;
  pGStack_10 = this;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
            (&this->m_vui16Values,&local_12);
  return;
}

Assistant:

void GridDataType1:: AddValue( KUINT16 V )
{
    ++m_ui16NumValues;
    m_vui16Values.push_back( V );
}